

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadrilateral.h
# Opt level: O0

bool ZXing::IsInside<ZXing::PointT<int>>(PointT<int> *p,Quadrilateral<ZXing::PointT<int>_> *q)

{
  int iVar1;
  PointT<int> a;
  PointT<int> b;
  int i;
  int neg;
  int pos;
  PointT<int> *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  int *local_58;
  int local_1c;
  int local_18;
  int local_14 [5];
  
  local_14[0] = 0;
  local_18 = 0;
  for (local_1c = 0;
      iVar1 = Size<ZXing::Quadrilateral<ZXing::PointT<int>>>
                        ((Quadrilateral<ZXing::PointT<int>_> *)
                         CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0)),
      local_1c < iVar1; local_1c = local_1c + 1) {
    std::array<ZXing::PointT<int>,_4UL>::operator[]
              ((array<ZXing::PointT<int>,_4UL> *)
               CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               (size_type)in_stack_ffffffffffffff98);
    a = operator-<int,_int>(in_stack_ffffffffffffff98,(PointT<int> *)0x21178c);
    Size<ZXing::Quadrilateral<ZXing::PointT<int>>>
              ((Quadrilateral<ZXing::PointT<int>_> *)
               CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    std::array<ZXing::PointT<int>,_4UL>::operator[]
              ((array<ZXing::PointT<int>,_4UL> *)
               CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               (size_type)in_stack_ffffffffffffff98);
    std::array<ZXing::PointT<int>,_4UL>::operator[]
              ((array<ZXing::PointT<int>,_4UL> *)
               CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               (size_type)in_stack_ffffffffffffff98);
    b = operator-<int,_int>(in_stack_ffffffffffffff98,(PointT<int> *)0x2117e7);
    iVar1 = cross<int>(a,b);
    if (iVar1 < 0) {
      local_58 = &local_18;
    }
    else {
      local_58 = local_14;
    }
    *local_58 = *local_58 + 1;
  }
  return local_14[0] == 0 || local_18 == 0;
}

Assistant:

bool IsInside(const PointT& p, const Quadrilateral<PointT>& q)
{
	// Test if p is on the same side (right or left) of all polygon segments
	int pos = 0, neg = 0;
	for (int i = 0; i < Size(q); ++i)
		(cross(p - q[i], q[(i + 1) % Size(q)] - q[i]) < 0 ? neg : pos)++;
	return pos == 0 || neg == 0;
}